

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O3

void __thiscall Utf8Decode_OverlongAscii_Test::TestBody(Utf8Decode_OverlongAscii_Test *this)

{
  allocator_type *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator_type local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined4 local_6c;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_6c = CONCAT22(local_6c._2_2_,0xafc0);
  paVar1 = &local_89;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_6c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88,__l,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_28,&local_88,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6c = CONCAT13(local_6c._3_1_,0xaf80e0);
  paVar1 = &local_89;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_6c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88,__l_00,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_48,&local_88,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6c = 0xaf8080f0;
  paVar1 = &local_89;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_6c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88,__l_01,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_68,&local_88,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, OverlongAscii) {
    decode_bad (bytes ({0xC0, 0xAF}));             // U+002F
    decode_bad (bytes ({0xE0, 0x80, 0xAF}));       // U+002F
    decode_bad (bytes ({0xF0, 0x80, 0x80, 0xAF})); // U+002F
}